

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_get_peer_max_message_size(LINK_HANDLE link,uint64_t *peer_max_message_size)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  uint64_t *peer_max_message_size_local;
  LINK_HANDLE link_local;
  
  if ((link == (LINK_HANDLE)0x0) || (peer_max_message_size == (uint64_t *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_get_peer_max_message_size",0x451,1,
                "Bad arguments: link = %p, peer_max_message_size = %p",link,peer_max_message_size);
    }
    l._4_4_ = 0x452;
  }
  else if ((link->link_state == LINK_STATE_ATTACHED) ||
          (link->link_state == LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED)) {
    *peer_max_message_size = link->peer_max_message_size;
    l._4_4_ = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_get_peer_max_message_size",0x457,1,
                "Attempting to read peer max message size before it was received");
    }
    l._4_4_ = 0x458;
  }
  return l._4_4_;
}

Assistant:

int link_get_peer_max_message_size(LINK_HANDLE link, uint64_t* peer_max_message_size)
{
    int result;

    if ((link == NULL) ||
        (peer_max_message_size == NULL))
    {
        LogError("Bad arguments: link = %p, peer_max_message_size = %p",
            link, peer_max_message_size);
        result = MU_FAILURE;
    }
    else if ((link->link_state != LINK_STATE_ATTACHED) &&
        (link->link_state != LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED))
    {
        LogError("Attempting to read peer max message size before it was received");
        result = MU_FAILURE;
    }
    else
    {
        *peer_max_message_size = link->peer_max_message_size;
        result = 0;
    }

    return result;
}